

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O0

void __thiscall
amrex::MLNodeLaplacian::restriction
          (MLNodeLaplacian *this,int amrlev,int cmglev,MultiFab *crse,MultiFab *fine)

{
  undefined8 uVar1;
  bool bVar2;
  type period;
  IntVect *pIVar3;
  FabArray<amrex::FArrayBox> *in_RCX;
  int in_EDX;
  uint in_ESI;
  MultiFab *in_RDI;
  FabArrayBase *in_R8;
  Array4<const_double> *stfab;
  Array4<const_int> *mfab;
  Array4<const_double> *ffab;
  Array4<double> cfab;
  Box *bx;
  MFIter mfi;
  IntVect ratio;
  int idir;
  bool regular_coarsening;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *stencil;
  iMultiFab *dmsk;
  MultiFab *pcrse;
  BoxArray *ba;
  MultiFab cfine;
  bool need_parallel_copy;
  ulong in_stack_fffffffffffffae8;
  FabArray<amrex::FArrayBox> *pFVar4;
  BoxArray *in_stack_fffffffffffffaf0;
  FabArrayBase *in_stack_fffffffffffffaf8;
  FabArrayBase *in_stack_fffffffffffffb00;
  int ratio_00;
  undefined4 in_stack_fffffffffffffb08;
  CpOp in_stack_fffffffffffffb0c;
  CpOp op;
  FabArray<amrex::FArrayBox> *fa;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffb20;
  undefined1 *puVar5;
  anon_class_32_4_1c4e64f8 *in_stack_fffffffffffffb30;
  BoxArray *in_stack_fffffffffffffb38;
  MFIter *in_stack_fffffffffffffb50;
  undefined1 local_498 [64];
  undefined1 *local_458;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> **local_450;
  MFIter *local_448;
  undefined1 *local_440;
  undefined4 *local_438;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> **local_430;
  MFIter *local_428;
  undefined1 *local_420;
  undefined1 local_418 [64];
  undefined1 *local_3d8;
  MFIter local_3d0;
  undefined1 local_344 [28];
  undefined1 *local_328;
  MFIter local_320;
  undefined8 local_2bc;
  int local_2b4;
  undefined4 local_2b0;
  byte local_2a9;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *local_2a8;
  type local_2a0;
  FabArray<amrex::FArrayBox> *local_298;
  undefined1 local_290 [184];
  FabArray<amrex::FArrayBox> local_1d8;
  byte local_51;
  FabArrayBase *local_50;
  FabArray<amrex::FArrayBox> *local_48;
  int local_40;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  undefined8 *local_18;
  undefined4 local_c;
  undefined8 *local_8;
  
  pFVar4 = (FabArray<amrex::FArrayBox> *)(in_stack_fffffffffffffae8 & 0xffffffff00000000);
  local_50 = in_R8;
  local_48 = in_RCX;
  local_40 = in_EDX;
  (*(in_RDI->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[0x45])
            (in_RDI,(ulong)in_ESI,(ulong)(in_EDX - 1),in_R8,0);
  bVar2 = isMFIterSafe(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  ratio_00 = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  local_51 = (bVar2 ^ 0xffU) & 1;
  MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffffaf0);
  if ((local_51 & 1) != 0) {
    FabArrayBase::boxArray(local_50);
    amrex::coarsen((BoxArray *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                   ratio_00);
    puVar5 = local_290 + 0x48;
    local_290._176_8_ = puVar5;
    in_stack_fffffffffffffb30 = (anon_class_32_4_1c4e64f8 *)FabArrayBase::DistributionMap(local_50);
    local_290._24_8_ = 0;
    local_290._32_8_ = 0;
    local_290._8_8_ = 0;
    local_290._16_8_ = 0;
    local_290._40_8_ = 0;
    in_stack_fffffffffffffb38 = (BoxArray *)(local_290 + 8);
    MFInfo::MFInfo((MFInfo *)0x12d5d58);
    local_290._0_8_ = (_func_int **)0x0;
    pFVar4 = (FabArray<amrex::FArrayBox> *)local_290;
    DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffaf0);
    in_stack_fffffffffffffb20 = pFVar4;
    MultiFab::define(in_RDI,in_stack_fffffffffffffb38,
                     (DistributionMapping *)in_stack_fffffffffffffb30,(int)((ulong)puVar5 >> 0x20),
                     (int)puVar5,(MFInfo *)pFVar4,
                     (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffb50);
    DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x12d5db4);
    MFInfo::~MFInfo((MFInfo *)0x12d5dc1);
    BoxArray::~BoxArray(in_stack_fffffffffffffaf0);
  }
  fa = local_48;
  if ((local_51 & 1) != 0) {
    fa = (FabArray<amrex::FArrayBox> *)(local_290 + 0xb8);
  }
  local_298 = fa;
  Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                *)in_stack_fffffffffffffaf0,(size_type)pFVar4);
  Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                *)in_stack_fffffffffffffaf0,(size_type)pFVar4);
  period = std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator*
                     ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                      in_stack_fffffffffffffaf0);
  local_2a0 = period;
  Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                *)in_stack_fffffffffffffaf0,(size_type)pFVar4);
  local_2a8 = Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                            *)in_stack_fffffffffffffaf0,(size_type)pFVar4);
  local_2a9 = 1;
  local_2b0 = 2;
  op = in_stack_fffffffffffffb0c;
  if (0 < local_40) {
    local_28 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                         ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          in_stack_fffffffffffffaf0,(size_type)pFVar4);
    local_2c = 2;
    op = in_stack_fffffffffffffb0c & 0xffffff;
    if ((local_28->vect[0] == 2) &&
       (op = in_stack_fffffffffffffb0c & 0xffffff, local_28->vect[1] == 2)) {
      op = CONCAT13(local_28->vect[2] == 2,(int3)in_stack_fffffffffffffb0c);
    }
    local_2a9 = (byte)(op >> 0x18);
    pIVar3 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                       ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                        in_stack_fffffffffffffaf0,(size_type)pFVar4);
    uVar1 = *(undefined8 *)pIVar3->vect;
    local_2b4 = pIVar3->vect[2];
    local_8 = &local_2bc;
    local_c = 1;
    local_2bc._4_4_ = (int)((ulong)uVar1 >> 0x20);
    local_2bc = uVar1;
    if (local_2bc._4_4_ == 1) {
      local_2b0 = 1;
    }
    else {
      local_18 = &local_2bc;
      local_1c = 0;
      local_2bc._0_4_ = (int)uVar1;
      bVar2 = (int)local_2bc == 1;
      if (bVar2) {
        local_2b0 = 0;
      }
    }
  }
  pFVar4 = local_298;
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)in_stack_fffffffffffffb20,&fa->super_FabArrayBase,
                 SUB81((ulong)period >> 0x38,0));
  while (bVar2 = MFIter::isValid(&local_320), bVar2) {
    MFIter::tilebox(in_stack_fffffffffffffb50);
    local_328 = local_344;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (pFVar4,(MFIter *)in_stack_fffffffffffffaf0);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (pFVar4,(MFIter *)in_stack_fffffffffffffaf0);
    local_3d0.local_index_map = (Vector<int,_std::allocator<int>_> *)&local_3d0;
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              ((FabArray<amrex::IArrayBox> *)pFVar4,(MFIter *)in_stack_fffffffffffffaf0);
    local_3d8 = local_418;
    if (in_RDI[3].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_filled.vect[0] == 0) {
      if ((local_2a9 & 1) == 0) {
        local_450 = &local_3d0.tile_array;
        local_448 = (MFIter *)local_3d0.local_index_map;
        local_438 = &local_2b0;
        local_440 = local_3d8;
        LoopConcurrentOnCpu<amrex::MLNodeLaplacian::restriction(int,int,amrex::MultiFab&,amrex::MultiFab&)const::__1>
                  ((Box *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
      }
      else {
        local_430 = &local_3d0.tile_array;
        local_428 = (MFIter *)local_3d0.local_index_map;
        local_420 = local_3d8;
        LoopConcurrentOnCpu<amrex::MLNodeLaplacian::restriction(int,int,amrex::MultiFab&,amrex::MultiFab&)const::__0>
                  ((Box *)in_stack_fffffffffffffb38,
                   (anon_class_24_3_5d6d0c24 *)in_stack_fffffffffffffb30);
      }
    }
    else {
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x12d61e7);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (pFVar4,(MFIter *)in_stack_fffffffffffffaf0);
      local_458 = local_498;
      in_stack_fffffffffffffb50 = (MFIter *)local_3d0.local_index_map;
      LoopConcurrentOnCpu<amrex::MLNodeLaplacian::restriction(int,int,amrex::MultiFab&,amrex::MultiFab&)const::__2>
                ((Box *)in_stack_fffffffffffffb38,
                 (anon_class_32_4_0c5d7522 *)in_stack_fffffffffffffb30);
    }
    MFIter::operator++(&local_320);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffffaf0);
  if ((local_51 & 1) != 0) {
    Periodicity::NonPeriodic();
    FabArray<amrex::FArrayBox>::ParallelCopy(in_stack_fffffffffffffb20,fa,(Periodicity *)period,op);
  }
  MultiFab::~MultiFab((MultiFab *)0x12d62ad);
  return;
}

Assistant:

void
MLNodeLaplacian::restriction (int amrlev, int cmglev, MultiFab& crse, MultiFab& fine) const
{
    BL_PROFILE("MLNodeLaplacian::restriction()");

    applyBC(amrlev, cmglev-1, fine, BCMode::Homogeneous, StateMode::Solution);

    bool need_parallel_copy = !amrex::isMFIterSafe(crse, fine);
    MultiFab cfine;
    if (need_parallel_copy) {
        const BoxArray& ba = amrex::coarsen(fine.boxArray(), 2);
        cfine.define(ba, fine.DistributionMap(), 1, 0);
    }

    MultiFab* pcrse = (need_parallel_copy) ? &cfine : &crse;
    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][cmglev-1];

    const auto& stencil = m_stencil[amrlev][cmglev-1];

    bool regular_coarsening = true; int idir = 2;
    if (cmglev > 0) {
        regular_coarsening = mg_coarsen_ratio_vec[cmglev-1] == mg_coarsen_ratio;
        IntVect ratio = mg_coarsen_ratio_vec[cmglev-1];
        if (ratio[1] == 1) {
            idir = 1;
        } else if (ratio[0] == 1) {
            idir = 0;
        }
    }

#ifdef AMREX_USE_GPU
    auto pcrse_ma = pcrse->arrays();
    auto fine_ma = fine.const_arrays();
    auto msk_ma = dmsk.const_arrays();

    if (Gpu::inLaunchRegion()) {
        if (m_coarsening_strategy == CoarseningStrategy::Sigma)
        {
            if (regular_coarsening)
            {
                ParallelFor(*pcrse, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
                {
                    mlndlap_restriction(i,j,k,pcrse_ma[box_no],fine_ma[box_no],msk_ma[box_no]);
                });
            }
            else
            {
                ParallelFor(*pcrse, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
                {
                    mlndlap_semi_restriction(i,j,k,pcrse_ma[box_no],fine_ma[box_no],msk_ma[box_no],idir);
                });
            }
        }
        else
        {
            auto st_ma = stencil->const_arrays();
            ParallelFor(*pcrse, [=] AMREX_GPU_DEVICE(int box_no, int i, int j, int k) noexcept
            {
                mlndlap_restriction_rap(i,j,k,pcrse_ma[box_no],fine_ma[box_no],st_ma[box_no],msk_ma[box_no]);
            });
        }
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(*pcrse, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> cfab = pcrse->array(mfi);
            Array4<Real const> const& ffab = fine.const_array(mfi);
            Array4<int const> const& mfab = dmsk.const_array(mfi);
            if (m_coarsening_strategy == CoarseningStrategy::Sigma)
            {
                if (regular_coarsening)
                {
                    amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                    {
                        mlndlap_restriction(i,j,k,cfab,ffab,mfab);
                    });
                }
                else
                {
                    amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                    {
                        mlndlap_semi_restriction(i,j,k,cfab,ffab,mfab,idir);
                    });
                }
            }
            else
            {
                Array4<Real const> const& stfab = stencil->const_array(mfi);
                amrex::LoopConcurrentOnCpu(bx, [&] (int i, int j, int k) noexcept
                {
                    mlndlap_restriction_rap(i,j,k,cfab,ffab,stfab,mfab);
                });
            }
        }
    }

    if (need_parallel_copy) {
        crse.ParallelCopy(cfine);
    }
}